

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.cpp
# Opt level: O0

string * __thiscall OpenMD::CompositeVisitor::toString_abi_cxx11_(CompositeVisitor *this)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  reference ppVar4;
  string *in_RDI;
  char buffer [65535];
  VisitorIterator i;
  string *result;
  list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
  *in_stack_fffffffffffeff38;
  char *__s;
  string asStack_10068 [32];
  _Self _Stack_10048;
  _List_node_base *p_Stack_10040;
  _Self _Stack_10038;
  _List_node_base *p_Stack_10030;
  char acStack_10018 [65535];
  undefined1 local_19;
  _List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> local_18 [3];
  
  std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::_List_iterator(local_18);
  local_19 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  snprintf(acStack_10018,0xffff,
           "******************************************************************\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  uVar3 = std::__cxx11::string::c_str();
  snprintf(acStack_10018,0xffff,"Visitor name: %s\n",uVar3);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,
           "Visitor Description: visitor manager  maintaining a priority  list\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,"visitors in current priority list:\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  p_Stack_10030 =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
       ::begin(in_stack_fffffffffffeff38);
  local_18[0]._M_node = p_Stack_10030;
  while( true ) {
    _Stack_10038._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
         ::end(in_stack_fffffffffffeff38);
    bVar2 = std::operator!=(local_18,&_Stack_10038);
    if (!bVar2) break;
    ppVar4 = std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::operator*
                       ((_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> *)0x349cce);
    uVar1 = ppVar4->second;
    ppVar4 = std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::operator*
                       ((_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> *)0x349cdf);
    BaseVisitor::getVisitorName_abi_cxx11_(ppVar4->first);
    uVar3 = std::__cxx11::string::c_str();
    snprintf(acStack_10018,0xffff,"Priority = %d\tvisitor = %s\n",(ulong)uVar1,uVar3);
    std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
    std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::operator++(local_18);
  }
  snprintf(acStack_10018,0xffff,"Detail information about every visitor:\n");
  p_Stack_10040 =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
       ::begin(in_stack_fffffffffffeff38);
  local_18[0]._M_node = p_Stack_10040;
  while( true ) {
    _Stack_10048._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
         ::end(in_stack_fffffffffffeff38);
    bVar2 = std::operator!=(local_18,&_Stack_10048);
    if (!bVar2) break;
    ppVar4 = std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::operator*
                       ((_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_> *)0x349dd7);
    (*ppVar4->first->_vptr_BaseVisitor[10])(asStack_10068);
    std::__cxx11::string::operator+=((string *)in_RDI,asStack_10068);
    std::__cxx11::string::~string(asStack_10068);
    std::_List_iterator<std::pair<OpenMD::BaseVisitor_*,_int>_>::operator++(local_18);
  }
  __s = acStack_10018;
  snprintf(__s,0xffff,"******************************************************************\n");
  std::__cxx11::string::operator+=((string *)in_RDI,__s);
  return in_RDI;
}

Assistant:

const std::string CompositeVisitor::toString() {
    VisitorIterator i;
    std::string result;
    char buffer[65535];

    snprintf(
        buffer, 65535,
        "******************************************************************\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(
        buffer, 65535,
        "Visitor Description: visitor manager  maintaining a priority  list\n");
    result += buffer;

    snprintf(buffer, 65535, "visitors in current priority list:\n");
    result += buffer;

    for (i = visitorList.begin(); i != visitorList.end(); ++i) {
      snprintf(buffer, 65535, "Priority = %d\tvisitor = %s\n", (*i).second,
               ((*i).first->getVisitorName()).c_str());
      result += buffer;
    }

    snprintf(buffer, 65535, "Detail information about every visitor:\n");

    for (i = visitorList.begin(); i != visitorList.end(); ++i)
      result += ((*i).first)->toString();

    snprintf(
        buffer, 65535,
        "******************************************************************\n");
    result += buffer;

    return result;
  }